

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

void __thiscall Clasp::Cli::ClaspAppBase::printHelp(ClaspAppBase *this,OptionContext *root)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  ConfigKey k;
  
  Potassco::Application::printHelp(&this->super_Application,root);
  if (0 < (int)root->descLevel_) {
    pcVar2 = ClaspCliConfig::getDefaults(Asp);
    printf("[asp] %s\n",pcVar2);
    pcVar2 = ClaspCliConfig::getDefaults(Sat);
    printf("[cnf] %s\n",pcVar2);
    pcVar2 = ClaspCliConfig::getDefaults(Pb);
    printf("[opb] %s\n",pcVar2);
  }
  if ((int)root->descLevel_ < 2) {
    if (root->descLevel_ == desc_level_default) {
      iVar1 = (**(this->super_Application)._vptr_Application)(this);
      printf("\nType \'%s --help=2\' for more options and defaults\n",CONCAT44(extraout_var,iVar1));
      pcVar2 = "and ";
    }
    else {
      pcVar2 = "\nType ";
    }
    iVar1 = (**(this->super_Application)._vptr_Application)(this);
    printf("%s \'%s --help=3\' for all options and configurations.\n",pcVar2,
           CONCAT44(extraout_var_00,iVar1));
  }
  else {
    pcVar2 = "\nDefault configurations:";
    puts("\nDefault configurations:");
    k = config_asp_default;
    do {
      printConfig((ClaspAppBase *)pcVar2,k);
      k = k + config_asp_default;
    } while (k != config_default_max_value);
  }
  fflush(_stdout);
  return;
}

Assistant:

void ClaspAppBase::printHelp(const Potassco::ProgramOptions::OptionContext& root) {
	Potassco::Application::printHelp(root);
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e1) {
		printf("[asp] %s\n", ClaspCliConfig::getDefaults(Problem_t::Asp));
		printf("[cnf] %s\n", ClaspCliConfig::getDefaults(Problem_t::Sat));
		printf("[opb] %s\n", ClaspCliConfig::getDefaults(Problem_t::Pb));
	}
	if (root.getActiveDescLevel() >= Potassco::ProgramOptions::desc_level_e2) {
		printf("\nDefault configurations:\n");
		printDefaultConfigs();
	}
	else {
		const char* ht3 = "\nType ";
		if (root.getActiveDescLevel() == Potassco::ProgramOptions::desc_level_default) {
			printf("\nType '%s --help=2' for more options and defaults\n", getName());
			ht3 = "and ";
		}
		printf("%s '%s --help=3' for all options and configurations.\n", ht3, getName());
	}
	fflush(stdout);
}